

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall mognetwork::Socket::create(Socket *this,SocketFD fd)

{
  SocketFD SVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  int yes;
  int yes_1;
  
  iVar2 = this->m_socket;
  SVar1 = OsSocket::notValid();
  if (iVar2 == SVar1) {
    this->m_socket = fd;
    if (this->m_type == Tcp) {
      yes_1 = 1;
      iVar2 = setsockopt(fd,6,1,&yes_1,4);
      if (iVar2 != -1) {
        return;
      }
      pcVar4 = "Cannot set option \"TCP_NODELAY\" on the sockets.";
    }
    else {
      yes = 1;
      iVar2 = setsockopt(fd,1,6,&yes,4);
      if (iVar2 != -1) {
        return;
      }
      pcVar4 = "Failed to enable broadcast on UDP socket.";
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void Socket::create(SocketFD fd)
  {
    if (m_socket == mognetwork::OsSocket::notValid())
      {
	m_socket = fd;
	if (m_type == Tcp)
	  {
	    int yes = 1;
	    if (setsockopt(m_socket, IPPROTO_TCP, TCP_NODELAY, reinterpret_cast<char*>(&yes), sizeof(yes)) == -1)
	      {
		std::cerr << "Cannot set option \"TCP_NODELAY\" on the sockets." << std::endl;
	      }

#ifdef OS_MAC
	    if (setsockopt(m_socket, SOL_SOCKET, SO_NOSIGPIPE, reinterpret_cast<char*>(&yes), sizeof(yes)) == -1)
	      {
		std::cerr << "Cannot set option \"SO_NOSIGPIPE\" on the socket." << std::endl;
	      }
#endif // OS_MAC
	  }
	else
	  {
	    int yes = 1;
	    if (setsockopt(m_socket, SOL_SOCKET, SO_BROADCAST, reinterpret_cast<char*>(&yes), sizeof(yes)) == -1)
	      {
		std::cerr << "Failed to enable broadcast on UDP socket." << std::endl;
	      }
	  }
      }
  }